

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.h
# Opt level: O0

void __thiscall
capnp::List<capnp::schema::Node::SourceInfo,_(capnp::Kind)3>::Builder::setWithCaveats
          (Builder *this,uint index,Reader *reader)

{
  StructReader other;
  uint uVar1;
  uint index_00;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  StructBuilder local_48;
  Reader *local_20;
  Reader *reader_local;
  Builder *pBStack_10;
  uint index_local;
  Builder *this_local;
  
  local_20 = reader;
  reader_local._4_4_ = index;
  pBStack_10 = this;
  uVar1 = size(this);
  if (index < uVar1) {
    index_00 = bounded<unsigned_int>(reader_local._4_4_);
    capnp::_::ListBuilder::getStructElement(&local_48,&this->builder,index_00);
    memcpy(&local_78,local_20,0x30);
    other.capTable = (CapTableReader *)uStack_70;
    other.segment = (SegmentReader *)local_78;
    other.data = (void *)local_68;
    other.pointers = (WirePointer *)uStack_60;
    other.dataSize = (undefined4)local_58;
    other.pointerCount = local_58._4_2_;
    other._38_2_ = local_58._6_2_;
    other._40_8_ = uStack_50;
    capnp::_::StructBuilder::copyContentFrom(&local_48,other);
    return;
  }
  kj::_::inlineRequireFailure
            ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/list.h"
             ,0x11b,"index < size()","",(char *)0x0);
}

Assistant:

inline void setWithCaveats(uint index, const typename T::Reader& reader) {
      // Mostly behaves like you'd expect `set` to behave, but with a caveat originating from
      // the fact that structs in a struct list are allocated inline rather than by pointer:
      // If the source struct is larger than the target struct -- say, because the source was built
      // using a newer version of the schema that has additional fields -- it will be truncated,
      // losing data.
      //
      // Note: If you are trying to concatenate some lists, use Orphanage::newOrphanConcat() to
      //   do it without losing any data in case the source lists come from a newer version of the
      //   protocol. (Plus, it's easier to use anyhow.)

      KJ_IREQUIRE(index < size());
      builder.getStructElement(bounded(index) * ELEMENTS).copyContentFrom(reader._reader);
    }